

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O3

int ldefault(lua_State *L)

{
  int iVar1;
  int iVar2;
  sproto_type *st;
  void *pvVar3;
  char dummy [64];
  undefined1 auStack_78 [72];
  
  st = (sproto_type *)lua_touserdata(L,1);
  if (st != (sproto_type *)0x0) {
    lua_createtable(L,0,0);
    iVar1 = sproto_encode(st,auStack_78,0x40,encode_default,L);
    if (iVar1 < 0) {
      pvVar3 = lua_newuserdata(L,0x80);
      lua_rotate(L,-2,1);
      iVar1 = 0x80;
      iVar2 = sproto_encode(st,pvVar3,0x80,encode_default,L);
      while (iVar2 < 0) {
        iVar1 = iVar1 * 2;
        pvVar3 = lua_newuserdata(L,(long)iVar1);
        lua_copy(L,-1,-3);
        lua_settop(L,-2);
        iVar2 = sproto_encode(st,pvVar3,iVar1,encode_default,L);
      }
    }
    return 1;
  }
  iVar1 = luaL_argerror(L,1,"Need a sproto_type object");
  return iVar1;
}

Assistant:

static int
ldefault(lua_State *L) {
	int ret;
	// 64 is always enough for dummy buffer, except the type has many fields ( > 27).
	char dummy[64];
	struct sproto_type * st = lua_touserdata(L, 1);
	if (st == NULL) {
		return luaL_argerror(L, 1, "Need a sproto_type object");
	}
	lua_newtable(L);
	ret = sproto_encode(st, dummy, sizeof(dummy), encode_default, L);
	if (ret<0) {
		// try again
		int sz = sizeof(dummy) * 2;
		void * tmp = lua_newuserdata(L, sz);
		lua_insert(L, -2);
		for (;;) {
			ret = sproto_encode(st, tmp, sz, encode_default, L);
			if (ret >= 0)
				break;
			sz *= 2;
			tmp = lua_newuserdata(L, sz);
			lua_replace(L, -3);
		}
	}
	return 1;
}